

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

bool __thiscall
PartiallySignedTransaction::Merge(PartiallySignedTransaction *this,PartiallySignedTransaction *psbt)

{
  _Rb_tree_header *p_Var1;
  map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  *this_00;
  _Rb_tree_node_base *__k;
  long lVar2;
  const_iterator cVar3;
  _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
  *this_01;
  _Rb_tree<CExtPubKey,_CExtPubKey,_std::_Identity<CExtPubKey>,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>
  *this_02;
  _Base_ptr p_Var4;
  ulong uVar5;
  ulong uVar6;
  pointer pPVar7;
  pointer pPVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Txid local_78;
  Txid local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::GetHash(&local_58,(CMutableTransaction *)this);
  CMutableTransaction::GetHash(&local_78,(CMutableTransaction *)psbt);
  auVar12[0] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
  auVar12[1] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
  auVar12[2] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
  auVar12[3] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
  auVar12[4] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
  auVar12[5] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
  auVar12[6] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
  auVar12[7] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
  auVar12[8] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
  auVar12[9] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
  auVar12[10] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
  auVar12[0xb] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar12[0xc] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar12[0xd] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar12[0xe] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar12[0xf] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar11[0] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar11[1] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar11[2] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar11[3] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar11[4] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar11[5] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar11[6] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar11[7] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar11[8] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar11[9] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar11[10] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar11[0xb] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar11[0xc] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar11[0xd] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar11[0xe] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar11[0xf] = -(local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  local_58.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar11 = auVar11 & auVar12;
  bVar10 = (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff;
  if (bVar10) {
    pPVar7 = (this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
        super__Vector_impl_data._M_finish != pPVar7) {
      uVar5 = 0;
      uVar6 = 1;
      do {
        PSBTInput::Merge(pPVar7 + uVar5,
                         (psbt->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar5);
        pPVar7 = (this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = ((long)(this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pPVar7 >> 5) *
                -0x70a3d70a3d70a3d7;
        bVar9 = uVar6 <= uVar5;
        lVar2 = uVar5 - uVar6;
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar9 && lVar2 != 0);
    }
    pPVar8 = (this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
        super__Vector_impl_data._M_finish != pPVar8) {
      uVar5 = 0;
      uVar6 = 1;
      do {
        PSBTOutput::Merge(pPVar8 + uVar5,
                          (psbt->outputs).
                          super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar5);
        pPVar8 = (this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar5 = ((long)(this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pPVar8 >> 3) *
                0x6f96f96f96f96f97;
        bVar9 = uVar6 <= uVar5;
        lVar2 = uVar5 - uVar6;
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar9 && lVar2 != 0);
    }
    p_Var4 = (psbt->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(psbt->m_xpubs)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      this_00 = &this->m_xpubs;
      do {
        __k = p_Var4 + 1;
        cVar3 = std::
                _Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                ::find(&this_00->_M_t,(key_type *)__k);
        if ((_Rb_tree_header *)cVar3._M_node == &(this->m_xpubs)._M_t._M_impl.super__Rb_tree_header)
        {
          this_02 = &std::
                     map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                     ::operator[](this_00,(key_type *)__k)->_M_t;
          std::
          _Rb_tree<CExtPubKey,_CExtPubKey,_std::_Identity<CExtPubKey>,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>
          ::operator=(this_02,(_Rb_tree<CExtPubKey,_CExtPubKey,_std::_Identity<CExtPubKey>,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>
                               *)(p_Var4 + 2));
        }
        else {
          this_01 = (_Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
                     *)std::
                       map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                       ::operator[](this_00,(key_type *)__k);
          std::
          _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
          ::_M_insert_range_unique<std::_Rb_tree_const_iterator<CExtPubKey>>
                    (this_01,p_Var4[2]._M_right,
                     (_Rb_tree_const_iterator<CExtPubKey>)&p_Var4[2]._M_parent);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
    std::
    _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
    ::
    _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                *)&this->unknown,
               (psbt->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                )&(psbt->unknown)._M_t._M_impl.super__Rb_tree_header);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool PartiallySignedTransaction::Merge(const PartiallySignedTransaction& psbt)
{
    // Prohibited to merge two PSBTs over different transactions
    if (tx->GetHash() != psbt.tx->GetHash()) {
        return false;
    }

    for (unsigned int i = 0; i < inputs.size(); ++i) {
        inputs[i].Merge(psbt.inputs[i]);
    }
    for (unsigned int i = 0; i < outputs.size(); ++i) {
        outputs[i].Merge(psbt.outputs[i]);
    }
    for (auto& xpub_pair : psbt.m_xpubs) {
        if (m_xpubs.count(xpub_pair.first) == 0) {
            m_xpubs[xpub_pair.first] = xpub_pair.second;
        } else {
            m_xpubs[xpub_pair.first].insert(xpub_pair.second.begin(), xpub_pair.second.end());
        }
    }
    unknown.insert(psbt.unknown.begin(), psbt.unknown.end());

    return true;
}